

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::detail::fixed_static_array<unsigned_int,_256U>::fixed_static_array
          (fixed_static_array<unsigned_int,_256U> *this,uint size_in,uint *value_in)

{
  size_type_conflict sVar1;
  iterator puVar2;
  iterator puVar3;
  value_type *value_in_local;
  size_type_conflict size_in_local;
  fixed_static_array<unsigned_char,_3U> *this_local;
  
  array_detail::array<unsigned_int,_256UL>::array((array<unsigned_int,_256UL> *)this);
  sVar1 = static_size();
  if (size_in < sVar1) {
    puVar2 = array_detail::array<unsigned_int,_256UL>::begin((array<unsigned_int,_256UL> *)this);
    puVar3 = array_detail::array<unsigned_int,_256UL>::begin((array<unsigned_int,_256UL> *)this);
    fill_unsafe<unsigned_int*,unsigned_int>(puVar2,puVar3 + size_in,*value_in);
    puVar2 = array_detail::array<unsigned_int,_256UL>::begin((array<unsigned_int,_256UL> *)this);
    puVar3 = array_detail::array<unsigned_int,_256UL>::end((array<unsigned_int,_256UL> *)this);
    fill_unsafe<unsigned_int*,unsigned_int>(puVar2 + size_in,puVar3,0);
  }
  else {
    puVar2 = array_detail::array<unsigned_int,_256UL>::begin((array<unsigned_int,_256UL> *)this);
    puVar3 = array_detail::array<unsigned_int,_256UL>::end((array<unsigned_int,_256UL> *)this);
    fill_unsafe<unsigned_int*,unsigned_int>(puVar2,puVar3,*value_in);
  }
  return;
}

Assistant:

explicit constexpr fixed_static_array(const size_type      size_in,
                                          const value_type&    value_in = value_type(),
                                                allocator_type alloc_in = allocator_type())
    {
      static_cast<void>(alloc_in);

      if(size_in < static_size())
      {
        detail::fill_unsafe(base_class_type::begin(),     base_class_type::begin() + size_in, value_in);
        detail::fill_unsafe(base_class_type::begin() + size_in, base_class_type::end(),       value_type());
      }
      else
      {
        // Exclude this line from code coverage, even though explicit
        // test cases (search for "result_overshift_is_ok") are known
        // to cover this line.
        detail::fill_unsafe(base_class_type::begin(), base_class_type::end(), value_in); // LCOV_EXCL_LINE
      }
    }